

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

int get_password_response(uint32_t nonce,char *password,uint8_t *response)

{
  uint len;
  size_t sVar1;
  uint8_t *data;
  uint8_t *local_38;
  char *iter;
  uint8_t *pass_with_nonce;
  uint pass_with_nonce_len;
  uint8_t *response_local;
  char *password_local;
  uint32_t nonce_local;
  
  sVar1 = strlen(password);
  len = (int)sVar1 + 8;
  data = (uint8_t *)malloc((ulong)len);
  local_38 = data;
  for (response_local = (uint8_t *)password; *response_local != '\0';
      response_local = response_local + 1) {
    if (((char)*response_local < 'a') || ('z' < (char)*response_local)) {
      *local_38 = *response_local;
    }
    else {
      *local_38 = *response_local + 0xe0;
    }
    local_38 = local_38 + 1;
  }
  digest_to_hex32(nonce,(char *)local_38);
  digest_get(data,len,response);
  free(data);
  return 0;
}

Assistant:

int get_password_response(uint32_t nonce, const char *password,
			  uint8_t response[PROXY_PASS_RES_LEN])
{
	unsigned int pass_with_nonce_len = (unsigned int)strlen(password) + 8;
	uint8_t *pass_with_nonce = malloc(pass_with_nonce_len);
	char *iter = (char *)pass_with_nonce;

	while (*password != '\0') {
		if (*password >= 97 && *password <= 122)
			*iter = *password - 32;
		else
			*iter = *password;

		iter++;
		password++;
	}

	digest_to_hex32(nonce, iter);

	digest_get(pass_with_nonce, pass_with_nonce_len, response);

	free(pass_with_nonce);

	return 0;
}